

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O0

void verify_equal(char *input,size_t size,string *output)

{
  int iVar1;
  char *__s1;
  size_t sVar2;
  char *data;
  string *output_local;
  size_t size_local;
  char *input_local;
  
  __s1 = string_data(output);
  sVar2 = std::__cxx11::string::size();
  if (sVar2 == size) {
    iVar1 = memcmp(__s1,input,size);
    if (iVar1 == 0) {
      return;
    }
  }
  fprintf(_stderr,"uncompressed data does not match the input data\n");
  exit(3);
}

Assistant:

void verify_equal(const char* input, size_t size, std::string* output) {
  const char* data = string_data(output);
  if (output->size() == size && !memcmp(data, input, size))
    return;
  fprintf(stderr, "uncompressed data does not match the input data\n");
  exit(3);
}